

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O2

void __thiscall RigidBodyDynamics::Joint::Joint(Joint *this,Joint *joint)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  SpatialVector *pSVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar1 = joint->mDoFCount;
  uVar2 = joint->q_index;
  uVar3 = joint->custom_joint_index;
  uVar6 = (ulong)joint->mDoFCount;
  this->mJointType = joint->mJointType;
  this->mDoFCount = uVar1;
  this->q_index = uVar2;
  this->custom_joint_index = uVar3;
  pSVar4 = (SpatialVector *)operator_new__(uVar6 * 0x30);
  this->mJointAxes = pSVar4;
  lVar7 = 0;
  for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
              ((Matrix<double,_6,_1,_0,_6,_1> *)
               ((long)(this->mJointAxes->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar7),
               (Matrix<double,_6,_1,_0,_6,_1> *)
               ((long)(joint->mJointAxes->super_Matrix<double,_6,_1,_0,_6,_1>).
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                      array + lVar7));
    uVar6 = (ulong)this->mDoFCount;
    lVar7 = lVar7 + 0x30;
  }
  return;
}

Assistant:

Joint (const Joint &joint) :
    mJointType (joint.mJointType),
    mDoFCount (joint.mDoFCount),
    q_index (joint.q_index),
    custom_joint_index(joint.custom_joint_index)
  {
    mJointAxes = new Math::SpatialVector[mDoFCount];

    for (unsigned int i = 0; i < mDoFCount; i++) {
      mJointAxes[i] = joint.mJointAxes[i];
    }
  }